

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::ParseOneMapEntry
                 (NodeBase *node,char *ptr,ParseContext *ctx,FieldAux *aux,TcParseTableBase *table,
                 FieldEntry *entry,Arena *arena)

{
  bool bVar1;
  int8_t iVar2;
  byte bVar3;
  WireType WVar4;
  uint32_t uVar5;
  CppType CVar6;
  int v1;
  int v2;
  ulong uVar7;
  LogMessage *pLVar8;
  undefined1 auVar9 [16];
  string_view field_name;
  string_view message_name;
  undefined1 in_stack_fffffffffffffd08;
  LogMessageFatal local_2a8 [18];
  Voidify local_296;
  uchar local_295;
  uint local_294;
  string *local_290;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_278 [16];
  LogMessageFatal local_268 [23];
  Voidify local_251;
  string *local_250;
  string *absl_log_internal_check_op_result;
  char *local_240;
  string_view local_238;
  undefined1 local_228 [16];
  byte local_211;
  string *psStack_210;
  bool do_utf8_check;
  string *str;
  int size;
  uint32_t v;
  uint64_t tmp;
  void *obj;
  uint local_1e8;
  byte local_1e2;
  MapTypeCard type_card;
  uint32_t inner_tag;
  uint8_t value_tag;
  MapNodeSizeInfoT MStack_1dc;
  uint8_t key_tag;
  MapAuxInfo map_info;
  FieldEntry *entry_local;
  TcParseTableBase *table_local;
  FieldAux *aux_local;
  ParseContext *ctx_local;
  char *ptr_local;
  NodeBase *node_local;
  ulong local_1a0;
  int64_t res;
  ParseContext *local_190;
  ulong local_188;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  ParseContext *local_158;
  ParseContext *local_150;
  int64_t *local_148;
  int8_t local_131;
  ulong *local_130;
  int8_t local_119;
  int64_t *local_118;
  int8_t local_101;
  ulong *local_100;
  int8_t local_e9;
  int8_t local_d9;
  int8_t local_c9;
  int8_t local_b9;
  int8_t local_a9;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  _inner_tag = *aux;
  map_info = (MapAuxInfo)entry;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)node;
  WVar4 = MapTypeCard::wiretype((MapTypeCard *)&inner_tag);
  uVar5 = WireFormatLite::MakeTag(1,WVar4);
  type_card.data_ = (uint8_t)uVar5;
  WVar4 = MapTypeCard::wiretype((MapTypeCard *)((long)&inner_tag + 1));
  uVar5 = WireFormatLite::MakeTag(2,WVar4);
  local_1e2 = (byte)uVar5;
  do {
    while( true ) {
      bVar1 = ParseContext::Done(ctx,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      local_1e8 = (uint)*(char *)&(ctx_local->super_EpsCopyInputStream).limit_end_;
      if (local_1e8 == type_card.data_ || local_1e8 == local_1e2) break;
      ctx_local = (ParseContext *)ReadTag((char *)ctx_local,&local_1e8,0);
      if (local_1e8 == type_card.data_ || local_1e8 == local_1e2) goto LAB_001a84e3;
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      if ((local_1e8 == 0) || ((local_1e8 & 7) == 4)) {
        EpsCopyInputStream::SetLastTag(&ctx->super_EpsCopyInputStream,local_1e8);
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)UnknownFieldParse(local_1e8,(string *)0x0,(char *)ctx_local,ctx);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
    }
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
LAB_001a84e3:
    if (local_1e8 == type_card.data_) {
      obj._7_1_ = inner_tag._0_1_;
      tmp = (uint64_t)NodeBase::GetVoidKey((NodeBase *)ptr_local);
    }
    else {
      obj._7_1_ = inner_tag._1_1_;
      tmp = (uint64_t)NodeBase::GetVoidValue((NodeBase *)ptr_local,MStack_1dc);
    }
    WVar4 = MapTypeCard::wiretype((MapTypeCard *)((long)&obj + 7));
    switch(WVar4) {
    case WIRETYPE_VARINT:
      local_190 = ctx_local;
      res = (int64_t)&size;
      local_158 = ctx_local;
      last.p = (char **)&local_158;
      res2 = (int64_t)&local_158;
      iVar2 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
      local_1a0 = (ulong)iVar2;
      if (iVar2 < '\0') {
        local_131 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_148 = &res3;
        res3 = (long)local_131 << 7 | local_1a0 >> 0x39;
        local_d9 = local_131;
        if (res3 < 0) {
          local_119 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                (&last);
          local_130 = &local_188;
          local_188 = (long)local_119 << 0xe | local_1a0 >> 0x32;
          local_c9 = local_119;
          if ((long)local_188 < 0) {
            local_101 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                  (&last);
            local_118 = &res3;
            res3 = ((long)local_101 << 0x15 | local_1a0 >> 0x2b) & res3;
            local_b9 = local_101;
            if (res3 < 0) {
              local_e9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   (&last);
              local_100 = &local_188;
              local_188 = ((long)local_e9 << 0x1c | local_1a0 >> 0x24) & local_188;
              local_a9 = local_e9;
              if ((long)local_188 < 0) {
                local_91 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()(&last);
                local_a8 = &res3;
                res3 = ((long)local_91 << 0x23 | local_1a0 >> 0x1d) & res3;
                local_39 = local_91;
                if (res3 < 0) {
                  local_79 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()(&last);
                  local_90 = &local_188;
                  local_188 = ((long)local_79 << 0x2a | local_1a0 >> 0x16) & local_188;
                  local_29 = local_79;
                  if ((long)local_188 < 0) {
                    local_61 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                               operator()(&last);
                    local_78 = &res3;
                    res3 = ((long)local_61 << 0x31 | local_1a0 >> 0xf) & res3;
                    local_19 = local_61;
                    if (res3 < 0) {
                      local_49 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                 operator()(&last);
                      local_60 = &local_188;
                      local_188 = ((long)local_49 << 0x38 | local_1a0 >> 8) & local_188;
                      local_9 = local_49;
                      if ((long)local_188 < 0) {
                        iVar2 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                operator()(&last);
                        if (iVar2 != '\x01') {
                          iVar2 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                  operator()((anon_class_8_1_54a39810 *)&res2);
                          if (((int)iVar2 & 0x80U) != 0) {
                            local_150 = (ParseContext *)0x0;
                            goto LAB_001a8a97;
                          }
                          bVar3 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                  operator()((anon_class_8_1_54a39810 *)&res2);
                          if ((bVar3 & 1) == 0) {
                            local_188 = local_188 ^ 0x8000000000000000;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          res3 = local_188 & res3;
        }
        local_1a0 = res3 & local_1a0;
        if (local_158 == (ParseContext *)0x0) {
          protobuf_assumption_failed
                    ("p != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/varint_shuffle.h"
                     ,0x91);
        }
        local_150 = local_158;
      }
      else {
        local_150 = local_158;
      }
LAB_001a8a97:
      local_190 = local_150;
      *(ulong *)res = local_1a0;
      ctx_local = local_190;
      if (local_190 == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      CVar6 = MapTypeCard::cpp_type((MapTypeCard *)((long)&obj + 7));
      if (CVar6 == kBool) {
        *(bool *)tmp = _size != 0;
      }
      else if (CVar6 == k32) {
        str._4_4_ = (uint32_t)_size;
        bVar1 = MapTypeCard::is_zigzag((MapTypeCard *)((long)&obj + 7));
        if (bVar1) {
          str._4_4_ = WireFormatLite::ZigZagDecode32(str._4_4_);
        }
        *(uint32_t *)tmp = str._4_4_;
      }
      else {
        if (CVar6 != k64) {
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xa47);
        }
        bVar1 = MapTypeCard::is_zigzag((MapTypeCard *)((long)&obj + 7));
        if (bVar1) {
          _size = WireFormatLite::ZigZagDecode64(_size);
        }
        *(uint64_t *)tmp = _size;
      }
      break;
    case WIRETYPE_FIXED64:
      ctx_local = (ParseContext *)ReadFixed<unsigned_long>((void *)tmp,(char *)ctx_local);
      break;
    case WIRETYPE_LENGTH_DELIMITED:
      CVar6 = MapTypeCard::cpp_type((MapTypeCard *)((long)&obj + 7));
      if (CVar6 == kString) {
        str._0_4_ = ReadSize((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        psStack_210 = (string *)tmp;
        ctx_local = (ParseContext *)
                    EpsCopyInputStream::ReadString
                              (&ctx->super_EpsCopyInputStream,(char *)ctx_local,(uint32_t)str,
                               (string *)tmp);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        local_211 = (inner_tag._2_1_ >> 2 & 1) != 0 || (inner_tag._2_1_ >> 3 & 1) != 0;
        bVar1 = MapTypeCard::is_utf8((MapTypeCard *)((long)&obj + 7));
        if ((bVar1) && ((local_211 & 1) != 0)) {
          auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view(psStack_210);
          local_228 = auVar9;
          uVar7 = utf8_range::IsStructurallyValid(auVar9._0_8_,auVar9._8_8_);
          if ((uVar7 & 1) == 0) {
            local_238 = MessageName(table);
            _absl_log_internal_check_op_result = FieldName(table,(FieldEntry *)map_info);
            field_name._M_str = "parsing";
            field_name._M_len = (size_t)local_240;
            message_name._M_str = (char *)absl_log_internal_check_op_result;
            message_name._M_len = (size_t)local_238._M_str;
            PrintUTF8ErrorLog((internal *)local_238._M_len,message_name,field_name,(char *)0x0,
                              (bool)in_stack_fffffffffffffd08);
            if ((inner_tag._2_1_ >> 2 & 1) != 0) {
              return (char *)0x0;
            }
          }
        }
      }
      else {
        CVar6 = MapTypeCard::cpp_type((MapTypeCard *)((long)&obj + 7));
        v1 = absl::lts_20240722::log_internal::GetReferenceableValue(CVar6);
        v2 = absl::lts_20240722::log_internal::GetReferenceableValue(4);
        local_250 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                              (v1,v2,"+type_card.cpp_type() == +MapTypeCard::kMessage");
        if (local_250 != (string *)0x0) {
          local_278 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_250);
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_268,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0xa64,local_278._0_8_,local_278._8_8_);
          pLVar8 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_268);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_251,pLVar8);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_268);
        }
        local_294 = absl::lts_20240722::log_internal::GetReferenceableValue(local_1e8);
        local_295 = absl::lts_20240722::log_internal::GetReferenceableValue(local_1e2);
        local_290 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_char>
                              (&local_294,&local_295,"inner_tag == value_tag");
        if (local_290 != (string *)0x0) {
          auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_290);
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_2a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0xa65,auVar9._0_8_,auVar9._8_8_);
          pLVar8 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_2a8);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_296,pLVar8);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_2a8);
        }
        ctx_local = (ParseContext *)
                    ParseContext::ParseMessage(ctx,(MessageLite *)tmp,(char *)ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
      }
      break;
    default:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0xa6b);
    case WIRETYPE_FIXED32:
      ctx_local = (ParseContext *)ReadFixed<unsigned_int>((void *)tmp,(char *)ctx_local);
    }
  } while( true );
}

Assistant:

const char* TcParser::ParseOneMapEntry(
    NodeBase* node, const char* ptr, ParseContext* ctx,
    const TcParseTableBase::FieldAux* aux, const TcParseTableBase* table,
    const TcParseTableBase::FieldEntry& entry, Arena* arena) {
  using WFL = WireFormatLite;

  const auto map_info = aux[0].map_info;
  const uint8_t key_tag = WFL::MakeTag(1, map_info.key_type_card.wiretype());
  const uint8_t value_tag =
      WFL::MakeTag(2, map_info.value_type_card.wiretype());

  while (!ctx->Done(&ptr)) {
    uint32_t inner_tag = ptr[0];

    if (PROTOBUF_PREDICT_FALSE(inner_tag != key_tag &&
                               inner_tag != value_tag)) {
      // Do a full parse and check again in case the tag has non-canonical
      // encoding.
      ptr = ReadTag(ptr, &inner_tag);
      if (PROTOBUF_PREDICT_FALSE(inner_tag != key_tag &&
                                 inner_tag != value_tag)) {
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;

        if (inner_tag == 0 || (inner_tag & 7) == WFL::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(inner_tag);
          break;
        }

        ptr = UnknownFieldParse(inner_tag, nullptr, ptr, ctx);
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        continue;
      }
    } else {
      ++ptr;
    }

    MapTypeCard type_card;
    void* obj;
    if (inner_tag == key_tag) {
      type_card = map_info.key_type_card;
      obj = node->GetVoidKey();
    } else {
      type_card = map_info.value_type_card;
      obj = node->GetVoidValue(map_info.node_size_info);
    }

    switch (type_card.wiretype()) {
      case WFL::WIRETYPE_VARINT:
        uint64_t tmp;
        ptr = ParseVarint(ptr, &tmp);
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        switch (type_card.cpp_type()) {
          case MapTypeCard::kBool:
            *reinterpret_cast<bool*>(obj) = static_cast<bool>(tmp);
            continue;
          case MapTypeCard::k32: {
            uint32_t v = static_cast<uint32_t>(tmp);
            if (type_card.is_zigzag()) v = WFL::ZigZagDecode32(v);
            memcpy(obj, &v, sizeof(v));
            continue;
          }
          case MapTypeCard::k64:
            if (type_card.is_zigzag()) tmp = WFL::ZigZagDecode64(tmp);
            memcpy(obj, &tmp, sizeof(tmp));
            continue;
          default:
            Unreachable();
        }
      case WFL::WIRETYPE_FIXED32:
        ptr = ReadFixed<uint32_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_FIXED64:
        ptr = ReadFixed<uint64_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_LENGTH_DELIMITED:
        if (type_card.cpp_type() == MapTypeCard::kString) {
          const int size = ReadSize(&ptr);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          std::string* str = reinterpret_cast<std::string*>(obj);
          ptr = ctx->ReadString(ptr, size, str);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          bool do_utf8_check = map_info.fail_on_utf8_failure;
#ifndef NDEBUG
          do_utf8_check |= map_info.log_debug_utf8_failure;
#endif
          if (type_card.is_utf8() && do_utf8_check &&
              !utf8_range::IsStructurallyValid(*str)) {
            PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry),
                              "parsing", false);
            if (map_info.fail_on_utf8_failure) {
              return nullptr;
            }
          }
          continue;
        } else {
          ABSL_DCHECK_EQ(+type_card.cpp_type(), +MapTypeCard::kMessage);
          ABSL_DCHECK_EQ(inner_tag, value_tag);
          ptr = ctx->ParseMessage(reinterpret_cast<MessageLite*>(obj), ptr);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          continue;
        }
      default:
        Unreachable();
    }
  }
  return ptr;
}